

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xDisassembler.c
# Opt level: O0

_Bool TMS320C64x_getInstruction
                (csh ud,uint8_t *code,size_t code_len,MCInst *MI,uint16_t *size,uint64_t address,
                void *info)

{
  DecodeStatus DVar1;
  MCInst *in_RCX;
  ulong in_RDX;
  undefined2 *in_R8;
  DecodeStatus result;
  uint32_t insn;
  _Bool local_1;
  
  if (in_RDX < 4) {
    *in_R8 = 0;
    local_1 = false;
  }
  else {
    if (in_RCX->flat_insn->detail != (cs_detail *)0x0) {
      memset(in_RCX->flat_insn->detail,0,0x174);
    }
    DVar1 = decodeInstruction_4((uint8_t *)ud,(MCInst *)code,code_len._4_4_,(uint64_t)MI,
                                (MCRegisterInfo *)size,address._4_4_);
    if (DVar1 == MCDisassembler_Success) {
      *in_R8 = 4;
      local_1 = true;
    }
    else {
      MCInst_clear(in_RCX);
      *in_R8 = 0;
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool TMS320C64x_getInstruction(csh ud, const uint8_t *code, size_t code_len,
		MCInst *MI, uint16_t *size, uint64_t address, void *info)
{
	uint32_t insn;
	DecodeStatus result;

	if(code_len < 4) {
		*size = 0;
		return MCDisassembler_Fail;
	}

	if(MI->flat_insn->detail)
		memset(MI->flat_insn->detail, 0, offsetof(cs_detail, tms320c64x)+sizeof(cs_tms320c64x));

	insn = (code[3] << 0) | (code[2] << 8) | (code[1] << 16) | ((uint32_t) code[0] << 24);
	result = decodeInstruction_4(DecoderTable32, MI, insn, address, info, 0);

	if(result == MCDisassembler_Success) {
		*size = 4;
		return true;
	}

	MCInst_clear(MI);
	*size = 0;
	return false;
}